

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O0

int respond_ok(SOCKINFO *info,int time_out,subscription *sub,http_message_t *request)

{
  int iVar1;
  uint local_d0;
  int local_cc;
  int rc;
  int upnp_timeout;
  char timeout_str [100];
  int return_code;
  membuffer response;
  int minor;
  int major;
  http_message_t *request_local;
  subscription *sub_local;
  int time_out_local;
  SOCKINFO *info_local;
  
  local_cc = 0x1e;
  local_d0 = 0;
  http_CalcResponseVersion
            (request->major_version,request->minor_version,(int *)((long)&response.size_inc + 4),
             (int *)&response.size_inc);
  if (time_out < 0) {
    memset(&rc,0,100);
    strncpy((char *)&rc,"TIMEOUT: Second-infinite",99);
  }
  else {
    local_d0 = snprintf((char *)&rc,100,"TIMEOUT: Second-%d",(ulong)(uint)time_out);
  }
  if (((int)local_d0 < 0) || (99 < local_d0)) {
    error_respond(info,500,request);
    info_local._4_4_ = -0x68;
  }
  else {
    membuffer_init((membuffer *)(timeout_str + 0x60));
    response.capacity = 0x1e;
    iVar1 = http_MakeMessage((membuffer *)(timeout_str + 0x60),response.size_inc._4_4_,
                             (int)response.size_inc,"RDSNXcsscscc",200,0,"redsonic","SID: ",sub,&rc)
    ;
    if (iVar1 == 0) {
      timeout_str._92_4_ = http_SendMessage(info,&local_cc,"b",stack0xffffffffffffffa0,response.buf)
      ;
      membuffer_destroy((membuffer *)(timeout_str + 0x60));
      info_local._4_1_ = timeout_str[0x5c];
      info_local._5_1_ = timeout_str[0x5d];
      info_local._6_1_ = timeout_str[0x5e];
      info_local._7_1_ = timeout_str[0x5f];
    }
    else {
      membuffer_destroy((membuffer *)(timeout_str + 0x60));
      error_respond(info,500,request);
      info_local._4_4_ = -0x68;
    }
  }
  return info_local._4_4_;
}

Assistant:

static int respond_ok(
	/*! [in] Socket connection of request. */
	SOCKINFO *info,
	/*! [in] Accepted duration. */
	int time_out,
	/*! [in] Accepted subscription. */
	subscription *sub,
	/*! [in] Http request. */
	http_message_t *request)
{
	int major;
	int minor;
	membuffer response;
	int return_code;
	char timeout_str[100];
	int upnp_timeout = UPNP_TIMEOUT;
	int rc = 0;

	http_CalcResponseVersion(
		request->major_version, request->minor_version, &major, &minor);

	if (time_out >= 0) {
		rc = snprintf(timeout_str,
			sizeof(timeout_str),
			"TIMEOUT: Second-%d",
			time_out);
	} else {
		memset(timeout_str, 0, sizeof(timeout_str));
		strncpy(timeout_str,
			"TIMEOUT: Second-infinite",
			sizeof(timeout_str) - 1);
	}
	if (rc < 0 || (unsigned int)rc >= sizeof(timeout_str)) {
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		return UPNP_E_OUTOF_MEMORY;
	}

	membuffer_init(&response);
	response.size_inc = 30;
	if (http_MakeMessage(&response,
		    major,
		    minor,
		    "R"
		    "D"
		    "S"
		    "N"
		    "Xc"
		    "ssc"
		    "scc",
		    HTTP_OK,
		    (off_t)0,
		    X_USER_AGENT,
		    "SID: ",
		    sub->sid,
		    timeout_str) != 0) {
		membuffer_destroy(&response);
		error_respond(info, HTTP_INTERNAL_SERVER_ERROR, request);
		return UPNP_E_OUTOF_MEMORY;
	}

	return_code = http_SendMessage(
		info, &upnp_timeout, "b", response.buf, response.length);

	membuffer_destroy(&response);

	return return_code;
}